

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O3

void split_node_comp(dtree_t *tr,uint32 node_id,float32 ****mixw,float32 ****means,float32 ****vars,
                    uint32 *veclen,uint32 n_model,uint32 n_state,uint32 n_stream,uint32 n_density,
                    float32 *stwt,quest_t *all_q,uint32 n_all_q,pset_t *pset,uint32 n_base_phone,
                    uint32 **dfeat,uint32 n_dfeat,uint32 split_min,uint32 split_max,
                    float32 split_thr,float32 mwfloor)

{
  dtree_node_t *pdVar1;
  dtree_node_t *pdVar2;
  uint32 *puVar3;
  int iVar4;
  uint32 *id;
  uint32 *id_00;
  comp_quest_t *pcVar5;
  uint node_id_00;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  size_t n_elem;
  uint32 n_model_00;
  undefined8 in_stack_ffffffffffffff48;
  pset_t *ppVar11;
  
  pdVar2 = tr->node;
  pdVar1 = pdVar2 + node_id;
  puVar3 = pdVar2[node_id].id;
  uVar6 = (ulong)pdVar2[node_id].n_id;
  n_elem = 0;
  if (uVar6 == 0) {
    uVar7 = 0;
  }
  else {
    uVar10 = 0;
    uVar8 = 0;
    uVar7 = n_elem;
    do {
      iVar4 = eval_comp_quest((comp_quest_t *)pdVar1->q,dfeat[puVar3[uVar10]],n_dfeat);
      uVar8 = uVar8 + (iVar4 == 0);
      uVar7 = (ulong)((int)uVar7 + (uint)(iVar4 != 0));
      uVar10 = uVar10 + 1;
    } while (uVar6 != uVar10);
    n_elem = (size_t)uVar8;
  }
  id = (uint32 *)
       __ckd_calloc__(uVar7,4,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                      ,0x416);
  id_00 = (uint32 *)
          __ckd_calloc__(n_elem,4,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                         ,0x417);
  n_model_00 = (uint32)in_stack_ffffffffffffff48;
  if (uVar6 == 0) {
    uVar7 = 0;
    uVar10 = 0;
  }
  else {
    uVar9 = 0;
    uVar10 = 0;
    uVar7 = 0;
    do {
      uVar8 = puVar3[uVar9];
      iVar4 = eval_comp_quest((comp_quest_t *)pdVar1->q,dfeat[uVar8],n_dfeat);
      n_model_00 = (uint32)in_stack_ffffffffffffff48;
      if (iVar4 == 0) {
        id_00[uVar7] = uVar8;
        uVar7 = (ulong)((int)uVar7 + 1);
      }
      else {
        id[uVar10] = uVar8;
        uVar10 = (ulong)((int)uVar10 + 1);
      }
      uVar9 = uVar9 + 1;
    } while (uVar6 != uVar9);
  }
  uVar8 = tr->n_node;
  node_id_00 = uVar8 + 1;
  tr->n_node = uVar8 + 2;
  pdVar2 = tr->node;
  pdVar1->y = pdVar2 + uVar8;
  pdVar1->n = pdVar2 + node_id_00;
  pdVar2[uVar8].p = pdVar1;
  pdVar2[node_id_00].p = pdVar1;
  mk_node(pdVar2 + uVar8,uVar8,id,(uint32)uVar10,mixw,means,vars,veclen,n_model_00,n_state,n_stream,
          n_density,stwt,mwfloor);
  ppVar11 = pset;
  pcVar5 = mk_comp_quest(&pdVar1->y->wt_ent_dec,mixw,means,vars,veclen,n_model,n_state,n_stream,
                         n_density,stwt,id,(uint32)uVar10,all_q,n_all_q,pset,n_base_phone,dfeat,
                         n_dfeat,split_min,split_max,split_thr,mwfloor);
  pdVar1->y->q = pcVar5;
  mk_node(pdVar1->n,node_id_00,id_00,(uint32)uVar7,mixw,means,vars,veclen,(uint32)ppVar11,n_state,
          n_stream,n_density,stwt,mwfloor);
  pcVar5 = mk_comp_quest(&pdVar1->n->wt_ent_dec,mixw,means,vars,veclen,n_model,n_state,n_stream,
                         n_density,stwt,id_00,(uint32)uVar7,all_q,n_all_q,pset,n_base_phone,dfeat,
                         n_dfeat,split_min,split_max,split_thr,mwfloor);
  pdVar1->n->q = pcVar5;
  return;
}

Assistant:

void
split_node_comp(dtree_t *tr,
		uint32 node_id,
		float32 ****mixw,
                float32 ****means,
                float32 ****vars,
                uint32  *veclen,
		uint32 n_model,
		uint32 n_state,
		uint32 n_stream,
		uint32 n_density,
		float32 *stwt,
		quest_t *all_q,
		uint32 n_all_q,
		pset_t *pset,
		uint32 n_base_phone,
		uint32 **dfeat,
		uint32 n_dfeat,
		uint32  split_min,
		uint32  split_max,
		float32 split_thr,
		float32 mwfloor)
{
    uint32 *id, n_id;
    uint32 *id_yes, n_yes;
    uint32 *id_no, n_no;
    dtree_node_t *node;
    uint32 node_id_yes;
    uint32 node_id_no;
    uint32 ii, i;

    node = &tr->node[node_id];
    id = node->id;
    n_id = node->n_id;

    for (ii = 0, n_yes = 0, n_no = 0; ii < n_id; ii++) {
	i = id[ii];

	if (eval_comp_quest((comp_quest_t *)node->q, dfeat[i], n_dfeat)) {
	    ++n_yes;
	}
	else {
	    ++n_no;
	}
    }

#if 0
    fprintf(stderr, "Comp Split: ");
    print_comp_quest(stderr, pset, (comp_quest_t *)node->q);
    fprintf(stderr, " %u/%u %.3e\n", n_yes, n_no, node->wt_ent_dec);
#endif
    
    id_yes = ckd_calloc(n_yes, sizeof(uint32));
    id_no = ckd_calloc(n_no, sizeof(uint32));

    for (ii = 0, n_yes = 0, n_no = 0; ii < n_id; ii++) {
	i = id[ii];

	if (eval_comp_quest((comp_quest_t *)node->q, dfeat[i], n_dfeat)) {
	    id_yes[n_yes] = i;
	    ++n_yes;
	}
	else {
	    id_no[n_no] = i;
	    ++n_no;
	}
    }

    node_id_yes = tr->n_node++;
    node_id_no = tr->n_node++;

    node->y = &tr->node[node_id_yes];
    node->n = &tr->node[node_id_no];
    node->y->p = node;
    node->n->p = node;

    mk_node(node->y,
	    node_id_yes,
	    id_yes, n_yes,
	    mixw, means, vars, veclen,
            n_model, n_state, n_stream, n_density, stwt, mwfloor);

    node->y->q = (void *)mk_comp_quest(&(node->y->wt_ent_dec),
				       mixw, means, vars, veclen,
                                       n_model, n_state, n_stream, n_density, 
                                       stwt, id_yes, n_yes,
				       all_q, n_all_q, pset, n_base_phone,
				       dfeat, n_dfeat,
				       split_min, split_max, split_thr, mwfloor);

    mk_node(node->n,
	    node_id_no,
	    id_no, n_no,
	    mixw, means, vars, veclen,
            n_model, n_state, n_stream, n_density, stwt, mwfloor);

    node->n->q = (void *)mk_comp_quest(&(node->n->wt_ent_dec),
				       mixw, means, vars, veclen, 
                                       n_model, n_state, n_stream, n_density, 
                                       stwt, id_no, n_no,
				       all_q, n_all_q, pset, n_base_phone,
				       dfeat, n_dfeat,
				       split_min, split_max, split_thr, mwfloor);
}